

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book_perf_test.cc
# Opt level: O1

type test_cancel(order_book *ob,unsigned_long count)

{
  long lVar1;
  long lVar2;
  uint64_t order_id;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  if (count != 0) {
    order_id = 0;
    do {
      helix::order_book::cancel(ob,order_id,5);
      order_id = order_id + 1;
    } while (count != order_id);
  }
  lVar2 = std::chrono::_V2::system_clock::now();
  return (type)(lVar2 - lVar1);
}

Assistant:

auto test_cancel(order_book& ob, unsigned long count)
{
    auto start = clock_type::now();
    for (unsigned long i = 0; i < count; i++) {
        ob.cancel(i, quantity/2);
    }
    auto end = clock_type::now();
    return end - start;
}